

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O1

void __thiscall QSimplex::reducedRowEchelon(QSimplex *this)

{
  int fromIndex;
  
  if (1 < this->rows) {
    fromIndex = 1;
    do {
      combineRows(this,0,fromIndex,
                  -this->matrix[(int)this->matrix[(long)this->columns * (long)fromIndex]]);
      fromIndex = fromIndex + 1;
    } while (fromIndex < this->rows);
  }
  return;
}

Assistant:

void QSimplex::reducedRowEchelon()
{
    for (int i = 1; i < rows; ++i) {
        int factorInObjectiveRow = valueAt(i, 0);
        combineRows(0, i, -1 * valueAt(0, factorInObjectiveRow));
    }
}